

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O2

bool __thiscall MXNetNode::is_weight(MXNetNode *this)

{
  pointer pMVar1;
  __type _Var2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  long lVar4;
  long lVar5;
  
  lVar5 = -1;
  lVar4 = 0;
  do {
    pMVar1 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(int)(((long)(this->params->
                               super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar1) / 0x58);
    lVar5 = lVar5 + 1;
    if (lVar3 <= lVar5) break;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(pMVar1->name)._M_dataplus._M_p + lVar4);
    lVar4 = lVar4 + 0x58;
    _Var2 = std::operator==(__lhs,&this->name);
  } while (!_Var2);
  return lVar5 < lVar3;
}

Assistant:

bool MXNetNode::is_weight() const
{
    for (int i=0; i<(int)(*params).size(); i++)
    {
        const MXNetParam& p = (*params)[i];
        if (p.name == name)
            return true;
    }

    return false;
}